

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_x509.cc
# Opt level: O3

UniquePtr<CRYPTO_BUFFER> __thiscall bssl::x509_to_buffer(bssl *this,X509 *x509)

{
  __uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> _Var1;
  CRYPTO_BUFFER *pCVar2;
  __uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true> extraout_RAX;
  uint8_t *buf;
  uint8_t *local_18;
  undefined4 extraout_var;
  
  local_18 = (uint8_t *)0x0;
  _Var1._M_t.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl._0_4_ = i2d_X509(x509,&local_18);
  _Var1._M_t.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl._4_4_ = extraout_var;
  if ((int)(uint)_Var1._M_t.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl < 1) {
    *(undefined8 *)this = 0;
  }
  else {
    pCVar2 = CRYPTO_BUFFER_new(local_18,(ulong)(uint)_Var1._M_t.
                                                                                                          
                                                  super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_crypto_buffer_st_*,_false>.
                                                  _M_head_impl,(CRYPTO_BUFFER_POOL *)0x0);
    *(CRYPTO_BUFFER **)this = pCVar2;
    OPENSSL_free(local_18);
    _Var1._M_t.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
         (tuple<crypto_buffer_st_*,_bssl::internal::Deleter>)
         (tuple<crypto_buffer_st_*,_bssl::internal::Deleter>)
         extraout_RAX.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl;
  }
  return (UniquePtr<CRYPTO_BUFFER>)
         _Var1._M_t.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl;
}

Assistant:

static UniquePtr<CRYPTO_BUFFER> x509_to_buffer(X509 *x509) {
  uint8_t *buf = NULL;
  int cert_len = i2d_X509(x509, &buf);
  if (cert_len <= 0) {
    return 0;
  }

  UniquePtr<CRYPTO_BUFFER> buffer(CRYPTO_BUFFER_new(buf, cert_len, NULL));
  OPENSSL_free(buf);

  return buffer;
}